

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::parse_some
          (basic_csv_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  int iVar1;
  byte *pbVar2;
  pointer pcVar3;
  iterator iVar4;
  iterator iVar5;
  m_columns_filter<char,_std::allocator<char>_> *visitor_00;
  byte bVar6;
  bool bVar7;
  csv_parse_state cVar8;
  byte *pbVar9;
  byte bVar10;
  csv_errc __e;
  char cVar11;
  csv_mode local_4c;
  string_type *local_48;
  vector<jsoncons::csv::csv_parse_state,std::allocator<jsoncons::csv::csv_parse_state>> *local_40;
  vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *local_38;
  
  visitor_00 = (m_columns_filter<char,_std::allocator<char>_> *)visitor;
  if (this->mapping_kind_ == m_columns) {
    this->cursor_mode_ = false;
    visitor_00 = &this->m_columns_filter_;
  }
  pbVar2 = (byte *)this->input_end_;
  if (((byte *)this->input_ptr_ != pbVar2) || (this->more_ != true)) goto LAB_002e457f;
  cVar8 = this->state_;
  if (before_last_unquoted_field_tail < cVar8) {
    if (cVar8 == before_last_quoted_field) {
      end_quoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
      goto LAB_002e4573;
    }
    goto switchD_002e445b_caseD_1;
  }
  switch(cVar8) {
  case start:
    __e = source_error;
    goto LAB_002e50e7;
  default:
    goto switchD_002e445b_caseD_1;
  case end_record:
    if (this->column_index_ != 0) {
      end_record(this,&visitor_00->super_basic_json_visitor<char>,ec);
    }
    this->state_ = no_more_records;
    break;
  case no_more_records:
    pcVar3 = (this->stack_).
             super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pcVar3[-1] - header < 2) {
      (this->stack_).
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar3 + -1;
    }
    (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])(visitor_00,this,ec);
    this->more_ = (bool)(this->cursor_mode_ ^ 1);
    iVar1 = this->level_;
    if (this->mapping_kind_ == m_columns) {
      this->level_ = iVar1 + -1;
      if ((this->m_columns_filter_).state_ != done) {
        bVar7 = detail::m_columns_filter<char,_std::allocator<char>_>::replay_parse_events
                          (&this->m_columns_filter_,visitor,this->actual_cursor_mode_,
                           this->mark_level_);
        this->more_ = bVar7;
        break;
      }
    }
    else {
      if (iVar1 == this->mark_level_) {
        this->more_ = false;
      }
      this->level_ = iVar1 + -1;
    }
    this->state_ = accept;
    break;
  case unquoted_string:
    goto switchD_002e445b_caseD_9;
  case before_unquoted_string:
    (this->buffer_)._M_string_length = 0;
    *(this->buffer_)._M_dataplus._M_p = '\0';
switchD_002e445b_caseD_9:
    bVar7 = this->trim_leading_;
    if (((bVar7 | this->trim_trailing_) & 1U) != 0) {
      trim_string_buffer(this,bVar7,(bool)((~bVar7 | this->trim_trailing_) & 1));
    }
    if ((this->ignore_empty_values_ == true) && ((this->buffer_)._M_string_length == 0))
    goto switchD_002e445b_caseD_1;
    before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
    this->state_ = before_unquoted_field;
    break;
  case escaped_value:
    if (this->quote_escape_char_ == this->quote_char_) {
      if ((this->ignore_empty_values_ == true) && ((this->buffer_)._M_string_length == 0))
      goto switchD_002e445b_caseD_1;
      before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
      this->column_ = this->column_ + 1;
      this->state_ = before_last_quoted_field;
      break;
    }
LAB_002e50b0:
    __e = invalid_escaped_char;
    goto LAB_002e50e7;
  case accept:
    pcVar3 = (this->stack_).
             super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (((long)pcVar3 -
         (long)(this->stack_).
               super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
               ._M_impl.super__Vector_impl_data._M_start == 4) && (pcVar3[-1] == initial)) {
      (this->stack_).
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar3 + -1;
      (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[2])(visitor_00);
      this->state_ = done;
      goto LAB_002e50ec;
    }
    local_4c = header;
    if ((this->err_handler_).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_002e5173:
      std::__throw_bad_function_call();
    }
    (*(this->err_handler_)._M_invoker)
              ((_Any_data *)&this->err_handler_,&local_4c,&this->super_ser_context);
    __e = unexpected_eof;
LAB_002e50e7:
    std::error_code::operator=(ec,__e);
LAB_002e50ec:
    this->more_ = false;
    return;
  case before_unquoted_field:
  case before_last_unquoted_field:
    end_unquoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
    this->state_ = before_last_unquoted_field_tail;
    break;
  case before_last_unquoted_field_tail:
    pcVar3 = (this->stack_).
             super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pcVar3[-1] == subfields) {
      (this->stack_).
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar3 + -1;
      (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])
                (visitor_00,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      if ((this->mapping_kind_ != m_columns) && (this->level_ == this->mark_level_)) {
        this->more_ = false;
      }
      this->level_ = this->level_ + -1;
    }
LAB_002e4573:
    this->column_index_ = this->column_index_ + 1;
    goto switchD_002e445b_caseD_1;
  }
LAB_002e457f:
  pbVar9 = (byte *)this->input_ptr_;
  if (pbVar2 <= pbVar9) {
    return;
  }
  local_40 = (vector<jsoncons::csv::csv_parse_state,std::allocator<jsoncons::csv::csv_parse_state>>
              *)&this->state_stack_;
  local_48 = &this->buffer_;
  local_38 = &this->stack_;
LAB_002e45c1:
  if (this->more_ != true) {
    return;
  }
  if (before_last_quoted_field_tail < this->state_) {
switchD_002e45e3_caseD_5:
    local_4c = 5;
    if ((this->err_handler_).super__Function_base._M_manager == (_Manager_type)0x0)
    goto LAB_002e5173;
    (*(this->err_handler_)._M_invoker)
              ((_Any_data *)&this->err_handler_,&local_4c,&this->super_ser_context);
    __e = invalid_parse_state;
    goto LAB_002e50e7;
  }
  bVar10 = *pbVar9;
  cVar11 = (char)local_48;
  switch(this->state_) {
  case start:
    if (this->mapping_kind_ != m_columns) {
      (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[6])
                (visitor_00,0,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      this->level_ = this->level_ + 1;
      if (((this->assume_header_ == true) && (this->mapping_kind_ == n_rows)) &&
         ((this->column_names_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->column_names_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        this->column_index_ = 0;
        (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[6])
                  (visitor_00,0,this,ec);
        this->level_ = this->level_ + 1;
        this->more_ = (bool)(this->cursor_mode_ ^ 1);
      }
    }
    this->state_ = expect_comment_or_record;
    break;
  case cr:
    this->line_ = this->line_ + 1;
    this->column_ = 1;
    if (*pbVar9 == 10) {
      this->input_ptr_ = (char *)(pbVar9 + 1);
    }
    cVar8 = pop_state(this);
    this->state_ = cVar8;
    break;
  case expect_comment_or_record:
    (this->buffer_)._M_string_length = 0;
    *(this->buffer_)._M_dataplus._M_p = '\0';
    if (bVar10 != this->comment_starter_) {
      this->state_ = expect_record;
      break;
    }
    this->state_ = comment;
    goto LAB_002e4f0f;
  case expect_record:
    if (bVar10 < 0xd) {
      if (bVar10 == 9) goto LAB_002e4b1b;
      if (bVar10 != 10) goto LAB_002e4d0c;
      if (this->ignore_empty_lines_ != false) {
        this->line_ = this->line_ + 1;
        goto LAB_002e49d1;
      }
LAB_002e4d6d:
      begin_record(this,&visitor_00->super_basic_json_visitor<char>,ec);
      goto LAB_002e4647;
    }
    if (bVar10 != 0xd) {
      if (bVar10 != 0x20) {
LAB_002e4d0c:
        begin_record(this,&visitor_00->super_basic_json_visitor<char>,ec);
        if (bVar10 == this->quote_char_) goto LAB_002e4ef2;
        goto LAB_002e4998;
      }
LAB_002e4b1b:
      if (this->trim_leading_ == false) {
        std::__cxx11::string::push_back(cVar11);
        begin_record(this,&visitor_00->super_basic_json_visitor<char>,ec);
        this->state_ = unquoted_string;
        goto LAB_002e4ca1;
      }
      goto LAB_002e4ca8;
    }
    if (this->ignore_empty_lines_ == false) goto LAB_002e4d6d;
    this->input_ptr_ = (char *)(pbVar9 + 1);
    local_4c = subfields;
    iVar5._M_current =
         (this->state_stack_).
         super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->state_stack_).
        super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<jsoncons::csv::csv_parse_state,std::allocator<jsoncons::csv::csv_parse_state>>::
      _M_realloc_insert<jsoncons::csv::csv_parse_state_const&>(local_40,iVar5,&local_4c);
    }
    else {
      *iVar5._M_current = expect_record;
      (this->state_stack_).
      super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
    }
    this->state_ = cr;
    break;
  case end_record:
    if (0xc < bVar10) {
      if (bVar10 == 0xd) {
        this->line_ = this->line_ + 1;
        this->column_ = 1;
        this->state_ = expect_comment_or_record;
        end_record(this,&visitor_00->super_basic_json_visitor<char>,ec);
        local_4c = this->state_;
        iVar5._M_current =
             (this->state_stack_).
             super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->state_stack_).
            super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<jsoncons::csv::csv_parse_state,std::allocator<jsoncons::csv::csv_parse_state>>
          ::_M_realloc_insert<jsoncons::csv::csv_parse_state_const&>(local_40,iVar5,&local_4c);
        }
        else {
          *iVar5._M_current = local_4c;
          (this->state_stack_).
          super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        this->state_ = cr;
        goto LAB_002e4f13;
      }
      if (bVar10 == 0x20) goto LAB_002e4ca8;
LAB_002e513b:
      local_4c = 4;
      if ((this->err_handler_).super__Function_base._M_manager == (_Manager_type)0x0)
      goto LAB_002e5173;
      (*(this->err_handler_)._M_invoker)
                ((_Any_data *)&this->err_handler_,&local_4c,&this->super_ser_context);
      __e = syntax_error;
      goto LAB_002e50e7;
    }
    if (bVar10 == 9) goto LAB_002e4ca8;
    if (bVar10 != 10) goto LAB_002e513b;
    this->line_ = this->line_ + 1;
    this->column_ = 1;
    this->state_ = expect_comment_or_record;
    end_record(this,&visitor_00->super_basic_json_visitor<char>,ec);
    goto LAB_002e4f13;
  default:
    goto switchD_002e45e3_caseD_5;
  case comment:
    if (bVar10 == 0xd) {
      this->line_ = this->line_ + 1;
      if ((this->stack_).
          super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1] == header) {
        this->header_line_offset_ = this->header_line_offset_ + 1;
      }
      this->column_ = 1;
      this->state_ = expect_comment_or_record;
      local_4c = data;
      iVar5._M_current =
           (this->state_stack_).
           super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->state_stack_).
          super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<jsoncons::csv::csv_parse_state,std::allocator<jsoncons::csv::csv_parse_state>>::
        _M_realloc_insert<jsoncons::csv::csv_parse_state_const&>(local_40,iVar5,&local_4c);
        pbVar9 = (byte *)this->input_ptr_;
      }
      else {
        *iVar5._M_current = expect_comment_or_record;
        (this->state_stack_).
        super__Vector_base<jsoncons::csv::csv_parse_state,_std::allocator<jsoncons::csv::csv_parse_state>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      this->state_ = cr;
    }
    else {
      if (bVar10 != 10) goto LAB_002e4ca8;
      this->line_ = this->line_ + 1;
      if ((this->stack_).
          super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1] == header) {
        this->header_line_offset_ = this->header_line_offset_ + 1;
      }
LAB_002e49d1:
      this->column_ = 1;
      this->state_ = expect_comment_or_record;
    }
    goto LAB_002e4cac;
  case between_values:
    if ((bVar10 == 0xd) || (bVar10 == 10)) {
      bVar7 = this->trim_leading_;
      if (((bVar7 | this->trim_trailing_) & 1U) != 0) {
        trim_string_buffer(this,bVar7,(bool)((~bVar7 | this->trim_trailing_) & 1));
      }
      if ((this->ignore_empty_values_ == true) && ((this->buffer_)._M_string_length == 0))
      goto LAB_002e4647;
      before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
      this->state_ = before_last_quoted_field;
    }
    else if (bVar10 == this->field_delimiter_) {
      bVar7 = this->trim_leading_;
      if (((bVar7 | this->trim_trailing_) & 1U) != 0) {
        trim_string_buffer(this,bVar7,(bool)((~bVar7 | this->trim_trailing_) & 1));
      }
      before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
      this->state_ = before_quoted_field;
    }
    else {
      if ((this->subfield_delimiter_ == 0) || (bVar10 != this->subfield_delimiter_)) {
        if ((bVar10 == 0x20) || (bVar10 == 9)) goto LAB_002e4ca8;
        __e = unexpected_char_between_fields;
        goto LAB_002e50e7;
      }
      bVar7 = this->trim_leading_;
      if (((bVar7 | this->trim_trailing_) & 1U) != 0) {
        trim_string_buffer(this,bVar7,(bool)((~bVar7 | this->trim_trailing_) & 1));
      }
      before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
      this->state_ = before_quoted_subfield;
    }
    break;
  case quoted_string:
    if (bVar10 == this->quote_escape_char_) {
      this->state_ = escaped_value;
    }
    else if (bVar10 == this->quote_char_) {
      this->state_ = between_values;
    }
    else {
      std::__cxx11::string::push_back(cVar11);
LAB_002e4ca1:
      pbVar9 = (byte *)this->input_ptr_;
    }
    goto LAB_002e4ca8;
  case unquoted_string:
    if ((bVar10 == 0xd) || (bVar10 == 10)) {
      bVar7 = this->trim_leading_;
      if (((bVar7 | this->trim_trailing_) & 1U) != 0) {
        trim_string_buffer(this,bVar7,(bool)((~bVar7 | this->trim_trailing_) & 1));
      }
      if ((this->ignore_empty_values_ == true) && ((this->buffer_)._M_string_length == 0))
      goto LAB_002e4647;
      before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
      this->state_ = before_last_unquoted_field;
    }
    else if (bVar10 == this->field_delimiter_) {
      bVar7 = this->trim_leading_;
      if (((bVar7 | this->trim_trailing_) & 1U) != 0) {
        trim_string_buffer(this,bVar7,(bool)((~bVar7 | this->trim_trailing_) & 1));
      }
      before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
      this->state_ = before_unquoted_field;
    }
    else {
      if ((this->subfield_delimiter_ == 0) || (bVar10 != this->subfield_delimiter_)) {
        if (bVar10 != this->quote_char_) {
          std::__cxx11::string::push_back(cVar11);
          goto LAB_002e4f0f;
        }
LAB_002e4ef2:
        (this->buffer_)._M_string_length = 0;
        *(this->buffer_)._M_dataplus._M_p = '\0';
        goto LAB_002e4f07;
      }
      bVar7 = this->trim_leading_;
      if (((bVar7 | this->trim_trailing_) & 1U) != 0) {
        trim_string_buffer(this,bVar7,(bool)((~bVar7 | this->trim_trailing_) & 1));
      }
      before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
      this->state_ = before_unquoted_subfield;
    }
    break;
  case before_unquoted_string:
    (this->buffer_)._M_string_length = 0;
    *(this->buffer_)._M_dataplus._M_p = '\0';
LAB_002e4998:
    this->state_ = unquoted_string;
    break;
  case escaped_value:
    if (bVar10 == this->quote_char_) {
      std::__cxx11::string::push_back(cVar11);
LAB_002e4f07:
      this->state_ = quoted_string;
      goto LAB_002e4f0f;
    }
    if (this->quote_escape_char_ != this->quote_char_) goto LAB_002e50b0;
    this->state_ = between_values;
    break;
  case before_unquoted_field:
    end_unquoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
    goto LAB_002e4861;
  case before_unquoted_field_tail:
    pcVar3 = (this->stack_).
             super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pcVar3[-1] == subfields) {
      (this->stack_).
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar3 + -1;
      (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])
                (visitor_00,this,ec);
      bVar6 = this->cursor_mode_ ^ 1;
      bVar10 = bVar6;
      if (this->level_ == this->mark_level_) {
        bVar10 = 0;
      }
      if (this->mapping_kind_ == m_columns) {
        bVar10 = bVar6;
      }
      this->more_ = (bool)bVar10;
      this->level_ = this->level_ + -1;
      pbVar9 = (byte *)this->input_ptr_;
    }
    this->column_index_ = this->column_index_ + 1;
    this->state_ = before_unquoted_string;
    goto LAB_002e4ca8;
  case before_unquoted_field_tail1:
    pcVar3 = (this->stack_).
             super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pcVar3[-1] == subfields) {
      (this->stack_).
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar3 + -1;
      (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])
                (visitor_00,this,ec);
      bVar6 = this->cursor_mode_ ^ 1;
      bVar10 = bVar6;
      if (this->level_ == this->mark_level_) {
        bVar10 = 0;
      }
      if (this->mapping_kind_ == m_columns) {
        bVar10 = bVar6;
      }
      this->more_ = (bool)bVar10;
      this->level_ = this->level_ + -1;
      pbVar9 = (byte *)this->input_ptr_;
    }
    this->state_ = end_record;
LAB_002e4ca8:
    this->column_ = this->column_ + 1;
LAB_002e4cac:
    this->input_ptr_ = (char *)(pbVar9 + 1);
    break;
  case before_last_unquoted_field:
    end_unquoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
    this->state_ = before_last_unquoted_field_tail;
    break;
  case before_last_unquoted_field_tail:
  case before_last_quoted_field_tail:
    pcVar3 = (this->stack_).
             super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pcVar3[-1] == subfields) {
      (this->stack_).
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar3 + -1;
      (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])
                (visitor_00,this,ec);
      bVar6 = this->cursor_mode_ ^ 1;
      bVar10 = bVar6;
      if (this->level_ == this->mark_level_) {
        bVar10 = 0;
      }
      if (this->mapping_kind_ == m_columns) {
        bVar10 = bVar6;
      }
      this->more_ = (bool)bVar10;
      this->level_ = this->level_ + -1;
    }
    this->column_index_ = this->column_index_ + 1;
LAB_002e4647:
    this->state_ = end_record;
    break;
  case before_unquoted_subfield:
    iVar4._M_current =
         (this->stack_).
         super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar4._M_current[-1] == data) {
      local_4c = subfields;
      if (iVar4._M_current ==
          (this->stack_).
          super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::
        _M_realloc_insert<jsoncons::csv::csv_mode>(local_38,iVar4,&local_4c);
      }
      else {
        *iVar4._M_current = subfields;
        (this->stack_).
        super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[6])
                (visitor_00,0,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      this->level_ = this->level_ + 1;
    }
    this->state_ = before_unquoted_subfield_tail;
    break;
  case before_unquoted_subfield_tail:
    end_unquoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
    goto LAB_002e4688;
  case before_quoted_subfield:
    iVar4._M_current =
         (this->stack_).
         super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar4._M_current[-1] == data) {
      local_4c = subfields;
      if (iVar4._M_current ==
          (this->stack_).
          super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::
        _M_realloc_insert<jsoncons::csv::csv_mode>(local_38,iVar4,&local_4c);
      }
      else {
        *iVar4._M_current = subfields;
        (this->stack_).
        super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[6])
                (visitor_00,0,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      this->level_ = this->level_ + 1;
    }
    this->state_ = before_quoted_subfield_tail;
    break;
  case before_quoted_subfield_tail:
    end_quoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
LAB_002e4688:
    this->state_ = before_unquoted_string;
LAB_002e4f0f:
    this->column_ = this->column_ + 1;
LAB_002e4f13:
    this->input_ptr_ = this->input_ptr_ + 1;
    break;
  case before_quoted_field:
    end_quoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
LAB_002e4861:
    this->state_ = before_unquoted_field_tail;
    break;
  case before_last_quoted_field:
    end_quoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
    this->state_ = before_last_quoted_field_tail;
  }
  if (this->max_lines_ < this->line_) {
    this->state_ = done;
    this->more_ = false;
  }
  pbVar9 = (byte *)this->input_ptr_;
  if (pbVar2 <= pbVar9) {
    return;
  }
  goto LAB_002e45c1;
switchD_002e445b_caseD_1:
  this->state_ = end_record;
  goto LAB_002e457f;
}

Assistant:

void parse_some(basic_json_visitor<CharT>& visitor, std::error_code& ec)
    {
        basic_json_visitor<CharT>& local_visitor = (mapping_kind_ == csv_mapping_kind::m_columns) 
            ? m_columns_filter_ : visitor;

        switch (mapping_kind_)
        {
            case csv_mapping_kind::m_columns:
                cursor_mode_ = false;
                break;
            default:
                break;
        } 

        const CharT* local_input_end = input_end_;

        if (input_ptr_ == local_input_end && more_)
        {
            switch (state_)
            {
                case csv_parse_state::start:
                    ec = csv_errc::source_error;
                    more_ = false;
                    return;
                case csv_parse_state::before_unquoted_field:
                case csv_parse_state::before_last_unquoted_field:
                    end_unquoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_last_unquoted_field_tail;
                    break;
                case csv_parse_state::before_last_unquoted_field_tail:
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    ++column_index_;
                    state_ = csv_parse_state::end_record;
                    break;
                case csv_parse_state::before_unquoted_string: 
                    buffer_.clear();
                    JSONCONS_FALLTHROUGH;
                case csv_parse_state::unquoted_string: 
                    if (trim_leading_ || trim_trailing_)
                    {
                        trim_string_buffer(trim_leading_,trim_trailing_);
                    }
                    if (ignore_empty_values_ && buffer_.empty())
                    {
                        state_ = csv_parse_state::end_record;
                    }
                    else
                    {
                        before_value(local_visitor, ec);
                        state_ = csv_parse_state::before_unquoted_field;
                    }
                    break;
                case csv_parse_state::before_last_quoted_field:
                    end_quoted_string_value(local_visitor, ec);
                    ++column_index_;
                    state_ = csv_parse_state::end_record;
                    break;
                case csv_parse_state::escaped_value:
                    if (quote_escape_char_ == quote_char_)
                    {
                        if (!(ignore_empty_values_ && buffer_.empty()))
                        {
                            before_value(local_visitor, ec);
                            ++column_;
                            state_ = csv_parse_state::before_last_quoted_field;
                        }
                        else
                        {
                            state_ = csv_parse_state::end_record;
                        }
                    }
                    else
                    {
                        ec = csv_errc::invalid_escaped_char;
                        more_ = false;
                        return;
                    }
                    break;
                case csv_parse_state::end_record:
                    if (column_index_ > 0)
                    {
                        end_record(local_visitor, ec);
                    }
                    state_ = csv_parse_state::no_more_records;
                    break;
                case csv_parse_state::no_more_records: 
                    switch (stack_.back()) 
                    {
                        case csv_mode::header:
                            stack_.pop_back();
                            break;
                        case csv_mode::data:
                            stack_.pop_back();
                            break;
                        default:
                            break;
                    }
                    local_visitor.end_array(*this, ec);
                    more_ = !cursor_mode_;
                    if (mapping_kind_ != csv_mapping_kind::m_columns)
                    {
                        if (level() == mark_level_)
                        {
                            more_ = false;
                        }
                    }
                    --level_;
                    
                    if (mapping_kind_ == csv_mapping_kind::m_columns)
                    {
                        if (!m_columns_filter_.done())
                        {
                            more_ = m_columns_filter_.replay_parse_events(visitor, actual_cursor_mode_, mark_level_);
                        }
                        else
                        {
                            state_ = csv_parse_state::accept;
                        }
                    }
                    else
                    {
                        state_ = csv_parse_state::accept;
                    }
                    break;
                case csv_parse_state::accept:
                    if (!(stack_.size() == 1 && stack_.back() == csv_mode::initial))
                    {
                        err_handler_(csv_errc::unexpected_eof, *this);
                        ec = csv_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    stack_.pop_back();
                    local_visitor.flush();
                    state_ = csv_parse_state::done;
                    more_ = false;
                    return;
                default:
                    state_ = csv_parse_state::end_record;
                    break;
            }
        }

        for (; (input_ptr_ < local_input_end) && more_;)
        {
            CharT curr_char = *input_ptr_;

            switch (state_) 
            {
                case csv_parse_state::cr:
                    ++line_;
                    column_ = 1;
                    switch (*input_ptr_)
                    {
                        case '\n':
                            ++input_ptr_;
                            state_ = pop_state();
                            break;
                        default:
                            state_ = pop_state();
                            break;
                    }
                    break;
                case csv_parse_state::start:
                    if (mapping_kind_ != csv_mapping_kind::m_columns)
                    {
                        local_visitor.begin_array(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        ++level_;
                    }
                    if (assume_header_ && mapping_kind_ == csv_mapping_kind::n_rows && !column_names_.empty())
                    {
                        column_index_ = 0; 
                        local_visitor.begin_array(semantic_tag::none, *this, ec);
                        ++level_;
                        more_ = !cursor_mode_;
                        state_ = csv_parse_state::expect_comment_or_record;
                    }
                    else
                    {
                        state_ = csv_parse_state::expect_comment_or_record;
                    }
                    break;
                case csv_parse_state::comment: 
                    switch (curr_char)
                    {
                        case '\n':
                        {
                            ++line_;
                            if (stack_.back() == csv_mode::header)
                            {
                                ++header_line_offset_;
                            }
                            column_ = 1;
                            state_ = csv_parse_state::expect_comment_or_record;
                            break;
                        }
                        case '\r':
                            ++line_;
                            if (stack_.back() == csv_mode::header)
                            {
                                ++header_line_offset_;
                            }
                            column_ = 1;
                            state_ = csv_parse_state::expect_comment_or_record;
                            push_state(state_);
                            state_ = csv_parse_state::cr;
                            break;
                        default:
                            ++column_;
                            break;
                    }
                    ++input_ptr_;
                    break;
                
                case csv_parse_state::expect_comment_or_record:
                    buffer_.clear();
                    if (curr_char == comment_starter_)
                    {
                        state_ = csv_parse_state::comment;
                        ++column_;
                        ++input_ptr_;
                    }
                    else
                    {
                        state_ = csv_parse_state::expect_record;
                    }
                    break;
                case csv_parse_state::quoted_string: 
                    {
                        if (curr_char == quote_escape_char_)
                        {
                            state_ = csv_parse_state::escaped_value;
                        }
                        else if (curr_char == quote_char_)
                        {
                            state_ = csv_parse_state::between_values;
                        }
                        else
                        {
                            buffer_.push_back(static_cast<CharT>(curr_char));
                        }
                    }
                    ++column_;
                    ++input_ptr_;
                    break;
                case csv_parse_state::escaped_value: 
                    {
                        if (curr_char == quote_char_)
                        {
                            buffer_.push_back(static_cast<CharT>(curr_char));
                            state_ = csv_parse_state::quoted_string;
                            ++column_;
                            ++input_ptr_;
                        }
                        else if (quote_escape_char_ == quote_char_)
                        {
                            state_ = csv_parse_state::between_values;
                        }
                        else
                        {
                            ec = csv_errc::invalid_escaped_char;
                            more_ = false;
                            return;
                        }
                    }
                    break;
                case csv_parse_state::between_values:
                    switch (curr_char)
                    {
                        case '\r':
                        case '\n':
                        {
                            if (trim_leading_ || trim_trailing_)
                            {
                                trim_string_buffer(trim_leading_,trim_trailing_);
                            }
                            if (!(ignore_empty_values_ && buffer_.empty()))
                            {
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_last_quoted_field;
                            }
                            else
                            {
                                state_ = csv_parse_state::end_record;
                            }
                            break;
                        }
                        default:
                            if (curr_char == field_delimiter_)
                            {
                                if (trim_leading_ || trim_trailing_)
                                {
                                    trim_string_buffer(trim_leading_,trim_trailing_);
                                }
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_quoted_field;
                            }
                            else if (subfield_delimiter_ != char_type() && curr_char == subfield_delimiter_)
                            {
                                if (trim_leading_ || trim_trailing_)
                                {
                                    trim_string_buffer(trim_leading_,trim_trailing_);
                                }
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_quoted_subfield;
                            }
                            else if (curr_char == ' ' || curr_char == '\t')
                            {
                                ++column_;
                                ++input_ptr_;
                            }
                            else
                            {
                                ec = csv_errc::unexpected_char_between_fields;
                                more_ = false;
                                return;
                            }
                            break;
                    }
                    break;
                case csv_parse_state::before_unquoted_string: 
                {
                    buffer_.clear();
                    state_ = csv_parse_state::unquoted_string;
                    break;
                }
                case csv_parse_state::before_unquoted_field:
                    end_unquoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_unquoted_field_tail;
                    break;
                case csv_parse_state::before_unquoted_field_tail:
                {
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    ++column_index_;
                    state_ = csv_parse_state::before_unquoted_string;
                    ++column_;
                    ++input_ptr_;
                    break;
                }
                case csv_parse_state::before_unquoted_field_tail1:
                {
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    state_ = csv_parse_state::end_record;
                    ++column_;
                    ++input_ptr_;
                    break;
                }

                case csv_parse_state::before_last_unquoted_field:
                    end_unquoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_last_unquoted_field_tail;
                    break;

                case csv_parse_state::before_last_unquoted_field_tail:
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    ++column_index_;
                    state_ = csv_parse_state::end_record;
                    break;

                case csv_parse_state::before_unquoted_subfield:
                    if (stack_.back() == csv_mode::data)
                    {
                        stack_.push_back(csv_mode::subfields);
                        local_visitor.begin_array(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        ++level_;
                    }
                    state_ = csv_parse_state::before_unquoted_subfield_tail;
                    break; 
                case csv_parse_state::before_unquoted_subfield_tail:
                    end_unquoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_unquoted_string;
                    ++column_;
                    ++input_ptr_;
                    break;
                case csv_parse_state::before_quoted_field:
                    end_quoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_unquoted_field_tail; // return to unquoted
                    break;
                case csv_parse_state::before_quoted_subfield:
                    if (stack_.back() == csv_mode::data)
                    {
                        stack_.push_back(csv_mode::subfields);
                        local_visitor.begin_array(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        ++level_;
                    }
                    state_ = csv_parse_state::before_quoted_subfield_tail;
                    break; 
                case csv_parse_state::before_quoted_subfield_tail:
                    end_quoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_unquoted_string;
                    ++column_;
                    ++input_ptr_;
                    break;
                case csv_parse_state::before_last_quoted_field:
                    end_quoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_last_quoted_field_tail;
                    break;
                case csv_parse_state::before_last_quoted_field_tail:
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    ++column_index_;
                    state_ = csv_parse_state::end_record;
                    break;
                case csv_parse_state::unquoted_string: 
                {
                    switch (curr_char)
                    {
                        case '\n':
                        case '\r':
                        {
                            if (trim_leading_ || trim_trailing_)
                            {
                                trim_string_buffer(trim_leading_,trim_trailing_);
                            }
                            if (!(ignore_empty_values_ && buffer_.empty()))
                            {
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_last_unquoted_field;
                            }
                            else
                            {
                                state_ = csv_parse_state::end_record;
                            }
                            break;
                        }
                        default:
                            if (curr_char == field_delimiter_)
                            {
                                if (trim_leading_ || trim_trailing_)
                                {
                                    trim_string_buffer(trim_leading_,trim_trailing_);
                                }
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_unquoted_field;
                            }
                            else if (subfield_delimiter_ != char_type() && curr_char == subfield_delimiter_)
                            {
                                if (trim_leading_ || trim_trailing_)
                                {
                                    trim_string_buffer(trim_leading_,trim_trailing_);
                                }
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_unquoted_subfield;
                            }
                            else if (curr_char == quote_char_)
                            {
                                buffer_.clear();
                                state_ = csv_parse_state::quoted_string;
                                ++column_;
                                ++input_ptr_;
                            }
                            else
                            {
                                buffer_.push_back(static_cast<CharT>(curr_char));
                                ++column_;
                                ++input_ptr_;
                            }
                            break;
                    }
                    break;
                }
                case csv_parse_state::expect_record: 
                {
                    switch (curr_char)
                    {
                        case '\n':
                        {
                            if (!ignore_empty_lines_)
                            {
                                begin_record(local_visitor, ec);
                                state_ = csv_parse_state::end_record;
                            }
                            else
                            {
                                ++line_;
                                column_ = 1;
                                state_ = csv_parse_state::expect_comment_or_record;
                                ++input_ptr_;
                            }
                            break;
                        }
                        case '\r':
                            if (!ignore_empty_lines_)
                            {
                                begin_record(local_visitor, ec);
                                state_ = csv_parse_state::end_record;
                            }
                            else
                            {
                                ++input_ptr_;
                                push_state(state_);
                                state_ = csv_parse_state::cr;
                            }
                            break;
                        case ' ':
                        case '\t':
                            if (!trim_leading_)
                            {
                                buffer_.push_back(static_cast<CharT>(curr_char));
                                begin_record(local_visitor, ec);
                                state_ = csv_parse_state::unquoted_string;
                            }
                            ++column_;
                            ++input_ptr_;
                            break;
                        default:
                            begin_record(local_visitor, ec);
                            if (curr_char == quote_char_)
                            {
                                buffer_.clear();
                                state_ = csv_parse_state::quoted_string;
                                ++column_;
                                ++input_ptr_;
                            }
                            else
                            {
                                state_ = csv_parse_state::unquoted_string;
                            }
                            break;
                        }
                    break;
                    }
                case csv_parse_state::end_record: 
                {
                    switch (curr_char)
                    {
                        case '\n':
                        {
                            ++line_;
                            column_ = 1;
                            state_ = csv_parse_state::expect_comment_or_record;
                            end_record(local_visitor, ec);
                            ++input_ptr_;
                            break;
                        }
                        case '\r':
                            ++line_;
                            column_ = 1;
                            state_ = csv_parse_state::expect_comment_or_record;
                            end_record(local_visitor, ec);
                            push_state(state_);
                            state_ = csv_parse_state::cr;
                            ++input_ptr_;
                            break;
                        case ' ':
                        case '\t':
                            ++column_;
                            ++input_ptr_;
                            break;
                        default:
                            err_handler_(csv_errc::syntax_error, *this);
                            ec = csv_errc::syntax_error;
                            more_ = false;
                            return;
                        }
                    break;
                }
                default:
                    err_handler_(csv_errc::invalid_parse_state, *this);
                    ec = csv_errc::invalid_parse_state;
                    more_ = false;
                    return;
            }
            if (line_ > max_lines_)
            {
                state_ = csv_parse_state::done;
                more_ = false;
            }
        }
    }